

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnForward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *F,
          DecomposeType dec)

{
  longdouble lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *poVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  longdouble lVar14;
  complex<long_double> __r;
  complex<long_double> udiag;
  
  if (this->fSymmetric == EIsSymmetric) {
    uVar12 = 0;
    while( true ) {
      lVar14 = (longdouble)0;
      if ((long)this->fNumEq <= (long)uVar12) break;
      iVar11 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12];
      lVar9 = (long)iVar11;
      pcVar8 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
               super_TPZVec<std::complex<long_double>_>.fStore;
      lVar1 = *(longdouble *)(pcVar8[lVar9]._M_value + 0x10);
      if (*(longdouble *)pcVar8[lVar9]._M_value == lVar14) {
        if ((lVar1 == lVar14) && (!NAN(lVar1) && !NAN(lVar14))) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Diagonal Value = 0 >> Aborting on Index = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
          poVar6 = std::operator<<(poVar6," Equation = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar12);
          std::endl<char,std::char_traits<char>>(poVar6);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0x8b);
        }
      }
      if (uVar12 == this->fNumEq - 1) {
        iVar11 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                      super_TPZVec<std::complex<long_double>_>.fNElements;
      }
      else {
        iVar11 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar8 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<long_double>::operator/=(pcVar7,pcVar8 + lVar9);
      }
      pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar9],0);
      uVar2 = *(undefined8 *)pcVar8->_M_value;
      uVar3 = *(undefined8 *)(pcVar8->_M_value + 8);
      uVar4 = *(undefined8 *)(pcVar8->_M_value + 0x10);
      uVar5 = *(undefined8 *)(pcVar8->_M_value + 0x18);
      lVar10 = lVar9;
      lVar13 = lVar9 * 0x20;
      while( true ) {
        lVar10 = lVar10 + 1;
        if (iVar11 <= lVar10) break;
        __r._M_value._24_2_ = SUB82(uVar5,0);
        __r._M_value._26_6_ = SUB86((ulong)uVar5 >> 0x10,0);
        __r._M_value._8_2_ = SUB82(uVar3,0);
        __r._M_value._10_6_ = SUB86((ulong)uVar3 >> 0x10,0);
        __r._M_value._0_8_ = uVar2;
        __r._M_value._16_8_ = uVar4;
        std::complex<long_double>::operator*=
                  (&__r,(complex<long_double> *)
                        ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                         super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar13));
        pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar10],0);
        lVar14 = *(longdouble *)(pcVar8->_M_value + 0x10);
        *(longdouble *)pcVar8->_M_value =
             *(longdouble *)pcVar8->_M_value -
             (longdouble)CONCAT28(__r._M_value._8_2_,__r._M_value._0_8_);
        *(longdouble *)(pcVar8->_M_value + 0x10) =
             lVar14 - (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
        lVar13 = lVar13 + 0x20;
      }
      if (dec == ELDLt) {
        pcVar8 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<long_double>::operator/=(pcVar7,pcVar8 + lVar9);
      }
      uVar12 = uVar12 + 1;
    }
  }
  else if (this->fSymmetric == EIsNonSymmetric) {
    uVar12 = 1;
    while( true ) {
      lVar14 = (longdouble)0;
      if ((long)this->fNumEq <= (long)uVar12) break;
      iVar11 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12];
      lVar9 = (long)iVar11;
      pcVar8 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
               super_TPZVec<std::complex<long_double>_>.fStore;
      lVar1 = *(longdouble *)(pcVar8[lVar9]._M_value + 0x10);
      if (*(longdouble *)pcVar8[lVar9]._M_value == lVar14) {
        if ((lVar1 == lVar14) && (!NAN(lVar1) && !NAN(lVar14))) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Diagonal Value = 0 >> Aborting on Index = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
          poVar6 = std::operator<<(poVar6," Equation = ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar12);
          std::endl<char,std::char_traits<char>>(poVar6);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/tpzeqnarray.cpp"
                     ,0xa5);
        }
      }
      if (uVar12 == this->fNumEq - 1) {
        iVar11 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                      super_TPZVec<std::complex<long_double>_>.fNElements;
      }
      else {
        iVar11 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar12 + 1];
      }
      if ((dec & ~ELUPivot) == ELU) {
        pcVar8 = (this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                 super_TPZVec<std::complex<long_double>_>.fStore;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        std::complex<long_double>::operator/=(pcVar7,pcVar8 + lVar9);
      }
      pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar9],0);
      uVar2 = *(undefined8 *)pcVar8->_M_value;
      uVar3 = *(undefined8 *)(pcVar8->_M_value + 8);
      uVar4 = *(undefined8 *)(pcVar8->_M_value + 0x10);
      uVar5 = *(undefined8 *)(pcVar8->_M_value + 0x18);
      lVar10 = lVar9 * 0x20;
      while( true ) {
        lVar9 = lVar9 + 1;
        if (iVar11 <= lVar9) break;
        __r._M_value._24_2_ = SUB82(uVar5,0);
        __r._M_value._26_6_ = SUB86((ulong)uVar5 >> 0x10,0);
        __r._M_value._8_2_ = SUB82(uVar3,0);
        __r._M_value._10_6_ = SUB86((ulong)uVar3 >> 0x10,0);
        __r._M_value._0_8_ = uVar2;
        __r._M_value._16_8_ = uVar4;
        std::complex<long_double>::operator*=
                  (&__r,(complex<long_double> *)
                        ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                         super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar10));
        pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (F,(long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                    fStore[lVar9],0);
        lVar14 = *(longdouble *)(pcVar8->_M_value + 0x10);
        *(longdouble *)pcVar8->_M_value =
             *(longdouble *)pcVar8->_M_value -
             (longdouble)CONCAT28(__r._M_value._8_2_,__r._M_value._0_8_);
        *(longdouble *)(pcVar8->_M_value + 0x10) =
             lVar14 - (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
        lVar10 = lVar10 + 0x20;
      }
      uVar12 = uVar12 + 2;
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnForward(TPZFMatrix<TVar> & F, DecomposeType dec) {
	int j;
	if(IsSymmetric()==EIsSymmetric){
		
		for(j=0; j<fNumEq; j++) {
			int index = fEqStart[j];
			if(fEqValues[index] == (TVar)0.) {
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			int i;
			//+1 ou +2
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
			/** finalizacao para ldlt */
			if(dec == ELDLt) F(fIndex[index],0) /= fEqValues[index];
		}
	} else if(IsSymmetric()==EIsNonSymmetric) {
		for(j=1; j<fNumEq; j+=2) {
			int index = fEqStart[j];
			
			if(fEqValues[index] == (TVar)0.){
				cout << "Diagonal Value = 0 >> Aborting on Index = " << index << " Equation = " << j << endl;
				DebugStop();
			}          
			
			int last_term;
			if(j==fNumEq-1){
				last_term=fEqValues.NElements();
			}else last_term = fEqStart[j+1];
			//if(fEqStart.NElements()
			
			
			/** cholesky e lu */
			if(dec==ECholesky || dec==ELU) {
				F(fIndex[index],0) /= fEqValues[index];
			}
			/** ldlt cholesky lu */
			TVar udiag = F(fIndex[index],0);
			
			
			int i;
			for(i = index + 1; i < last_term; i++) F(fIndex[i],0) -= udiag * fEqValues[i];
		}
	}
}